

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

int Mpm_ObjAddCutToStore(Mpm_Man_t *p,Mpm_Cut_t *pCut,int ArrTime)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  Mpm_Uni_t *pMVar8;
  Mpm_Cut_t *p_00;
  int *piVar9;
  Mpm_Uni_t *pMVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  Mpm_Cut_t *pCut_00;
  Mpm_Cut_t *extraout_RDX;
  Mpm_Cut_t *extraout_RDX_00;
  Mpm_Cut_t *extraout_RDX_01;
  Mpm_Uni_t *extraout_RDX_02;
  Mpm_Uni_t *extraout_RDX_03;
  Mpm_Uni_t *extraout_RDX_04;
  uint uVar14;
  int iVar15;
  Vec_Ptr_t *p_01;
  Mpm_Uni_t **ppMVar16;
  Mpm_Uni_t *Entry;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  
  piVar1 = (p->vMigRefs).pArray;
  piVar2 = (p->vMapRefs).pArray;
  piVar3 = (p->vEstRefs).pArray;
  piVar4 = (p->vAreas).pArray;
  piVar5 = (p->vEdges).pArray;
  p_01 = &p->vFreeUnits;
  pMVar8 = (Mpm_Uni_t *)Vec_PtrEntryLast(p_01);
  p_00 = &pMVar8->pCut;
  if (p_00 != pCut) {
    __assert_fail("&pUnit->pCut == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xb8,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  pMVar8->mTime = ArrTime;
  iVar6 = Mpm_CutGetArea(p,pCut);
  pMVar8->mArea = iVar6;
  iVar15 = (*(uint *)&pCut->field_0x4 >> 0x1b) * 0x32;
  pMVar8->mEdge = iVar15;
  *(undefined8 *)&pMVar8->mAveRefs = 0;
  *(undefined8 *)((long)&pMVar8->uSign + 4) = 0;
  for (uVar18 = 0; uVar11 = *(uint *)&pCut->field_0x4 >> 0x1b, uVar18 < uVar11; uVar18 = uVar18 + 1)
  {
    uVar11 = Abc_Lit2Var(pCut->pLeaves[uVar18]);
    iVar7 = p->fMainRun;
    if ((iVar7 == 0) || (piVar2[uVar11] != 0)) {
      iVar6 = piVar3[uVar11];
      if (iVar6 < 1) {
        __assert_fail("pEstRefs[iLeaf] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                      ,200,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
      }
      iVar6 = (piVar4[uVar11] * 100) / iVar6 + pMVar8->mArea;
      pMVar8->mArea = iVar6;
      iVar15 = (piVar5[uVar11] * 100) / piVar3[uVar11] + pMVar8->mEdge;
      pMVar8->mEdge = iVar15;
      piVar9 = piVar2;
      if (iVar7 == 0) {
        piVar9 = piVar1;
      }
      pMVar8->mAveRefs = pMVar8->mAveRefs + piVar9[uVar11];
    }
    else {
      iVar6 = pMVar8->mArea + piVar4[uVar11];
      pMVar8->mArea = iVar6;
      iVar15 = pMVar8->mEdge + piVar5[uVar11];
      pMVar8->mEdge = iVar15;
    }
    pMVar8->uSign = pMVar8->uSign | 1L << ((byte)uVar11 & 0x3f);
  }
  iVar7 = pMVar8->mAveRefs * 0x32;
  iVar12 = uVar11 + (uVar11 == 0);
  pCut_00 = (Mpm_Cut_t *)((long)iVar7 % (long)iVar12 & 0xffffffff);
  pMVar8->mAveRefs = iVar7 / iVar12;
  if (0x3fffffff < pMVar8->mTime) {
    __assert_fail("pUnit->mTime <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xd0,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  if (0x3fffffff < iVar6) {
    __assert_fail("pUnit->mArea <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xd1,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  if (0x3fffffff < iVar15) {
    __assert_fail("pUnit->mEdge <= 0x3FFFFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                  ,0xd2,"Mpm_Uni_t *Mpm_CutSetupInfo(Mpm_Man_t *, Mpm_Cut_t *, int)");
  }
  uVar18 = (ulong)p->nCutStore;
  if (uVar18 == 0) {
    p->nCutStore = 1;
    p->pCutStore[0] = pMVar8;
    Vec_PtrPop(p_01);
  }
  else {
    iVar6 = p->nNumCuts;
    if (p->nCutStore == iVar6 + -1) {
      iVar6 = (*p->pCutCmp)(pMVar8,p->pCutStore[uVar18 - 1]);
      if (0 < iVar6) {
        return 0;
      }
      iVar6 = p->nNumCuts;
      uVar18 = (ulong)(uint)p->nCutStore;
      pCut_00 = extraout_RDX;
    }
    uVar11 = (uint)uVar18;
    if (iVar6 < (int)uVar11) {
      __assert_fail("p->nCutStore <= p->nNumCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                    ,0xfb,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
    ppMVar16 = p->pCutStore + ((uVar18 & 0xffffffff) - 1);
    do {
      uVar17 = (uint)uVar18;
      uVar14 = (int)uVar11 >> 0x1f & uVar11;
      if ((int)uVar17 < 1) break;
      iVar6 = (*p->pCutCmp)(pMVar8,*ppMVar16);
      uVar18 = (ulong)(uVar17 - 1);
      ppMVar16 = ppMVar16 + -1;
      pCut_00 = extraout_RDX_00;
      uVar14 = uVar17;
    } while (iVar6 < 1);
    uVar19 = 0;
    uVar18 = 0;
    if (0 < (int)uVar14) {
      uVar18 = (ulong)uVar14;
    }
    for (; uVar18 != uVar19; uVar19 = uVar19 + 1) {
      pMVar10 = p->pCutStore[uVar19];
      if (((*(uint *)&(pMVar10->pCut).field_0x4 >> 0x1b <=
            *(uint *)&(pMVar8->pCut).field_0x4 >> 0x1b) && ((pMVar10->uSign & ~pMVar8->uSign) == 0))
         && (iVar6 = Mpm_CutIsContained((Mpm_Man_t *)p_00,&pMVar10->pCut,pCut_00),
            pCut_00 = extraout_RDX_01, iVar6 != 0)) {
        return 0;
      }
    }
    if (((p->pCutStore[0]->pCut).field_0x7 & 4) != 0) {
      uVar14 = uVar14 & (*(int *)&(pMVar8->pCut).field_0x4 << 5) >> 0x1f;
    }
    pMVar10 = (Mpm_Uni_t *)Vec_PtrEntryLast(p_01);
    if (pMVar8 != pMVar10) {
      __assert_fail("pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                    ,0x11a,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
    Vec_PtrPop(p_01);
    iVar6 = p->nCutStore;
    iVar15 = iVar6 + 1;
    p->nCutStore = iVar15;
    pMVar10 = extraout_RDX_02;
    for (lVar13 = (long)iVar6; (int)uVar14 < lVar13; lVar13 = lVar13 + -1) {
      pMVar10 = p->pCutStore[lVar13 + -1];
      p->pCutStore[lVar13] = pMVar10;
    }
    p->pCutStore[(int)uVar14] = pMVar8;
    iVar6 = uVar14 + 1;
    for (lVar13 = (long)iVar6; lVar13 < iVar15; lVar13 = lVar13 + 1) {
      Entry = p->pCutStore[lVar13];
      if ((*(uint *)&(Entry->pCut).field_0x4 >> 0x1b < *(uint *)&(pMVar8->pCut).field_0x4 >> 0x1b)
         || ((pMVar8->uSign & ~Entry->uSign) != 0)) {
LAB_003ca67e:
        p->pCutStore[iVar6] = Entry;
        iVar6 = iVar6 + 1;
      }
      else {
        iVar15 = Mpm_CutIsContained((Mpm_Man_t *)&Entry->pCut,p_00,(Mpm_Cut_t *)pMVar10);
        if (iVar15 == 0) {
          Entry = p->pCutStore[lVar13];
          pMVar10 = extraout_RDX_03;
          goto LAB_003ca67e;
        }
        Vec_PtrPush(p_01,Entry);
        pMVar10 = extraout_RDX_04;
      }
      iVar15 = p->nCutStore;
    }
    p->nCutStore = iVar6;
    iVar15 = p->nNumCuts;
    if (iVar6 == iVar15) {
      p->nCutStore = iVar6 + -1;
      Vec_PtrPush(p_01,p->pCutStore[(long)iVar6 + -1]);
      iVar15 = p->nNumCuts;
      iVar6 = p->nCutStore;
    }
    if (iVar15 <= iVar6) {
      __assert_fail("p->nCutStore < p->nNumCuts",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMap.c"
                    ,0x13b,"int Mpm_ObjAddCutToStore(Mpm_Man_t *, Mpm_Cut_t *, int)");
    }
  }
  return 1;
}

Assistant:

int Mpm_ObjAddCutToStore( Mpm_Man_t * p, Mpm_Cut_t * pCut, int ArrTime )
{
    int fEnableContainment = 1;
    Mpm_Uni_t * pUnit, * pUnitNew;
    int k, iPivot, last;
    // create new unit
#ifdef MIG_RUNTIME
    abctime clk;
clk = Abc_Clock();
#endif
    pUnitNew = Mpm_CutSetupInfo( p, pCut, ArrTime );
#ifdef MIG_RUNTIME
p->timeEval += Abc_Clock() - clk;
#endif
    // special case when the cut store is empty
    if ( p->nCutStore == 0 )
    {
        p->pCutStore[p->nCutStore++] = pUnitNew;
        Vec_PtrPop( &p->vFreeUnits );
        return 1;
    }
    // special case when the cut store is full and last cut is better than new cut
    if ( p->nCutStore == p->nNumCuts-1 && p->pCutCmp(pUnitNew, p->pCutStore[p->nCutStore-1]) > 0 )
        return 0;

    // find place of the given cut in the store
    assert( p->nCutStore <= p->nNumCuts );
    for ( iPivot = p->nCutStore - 1; iPivot >= 0; iPivot-- )
        if ( p->pCutCmp(pUnitNew, p->pCutStore[iPivot]) > 0 ) // iPivot-th cut is better than new cut
            break;

    if ( fEnableContainment )
    {
#ifdef MIG_RUNTIME
clk = Abc_Clock();
#endif
        // filter this cut using other cuts
        for ( k = 0; k <= iPivot; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves >= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnit->uSign && 
                 Mpm_CutIsContained(p, &pUnitNew->pCut, &pUnit->pCut) )
            {
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
                return 0;
            }
        }
    }

    // special case when the best cut is useless while the new cut is not
    if ( p->pCutStore[0]->pCut.fUseless && !pUnitNew->pCut.fUseless )
        iPivot = -1;

    // add the cut to storage
    assert( pUnitNew == (Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits) );
    Vec_PtrPop( &p->vFreeUnits );

    // insert this cut at location iPivot
    iPivot++;
    for ( k = p->nCutStore++; k > iPivot; k-- )
        p->pCutStore[k] = p->pCutStore[k-1];
    p->pCutStore[iPivot] = pUnitNew;

    if ( fEnableContainment )
    {
        // filter other cuts using this cut
        for ( k = last = iPivot+1; k < p->nCutStore; k++ )
        {
            pUnit = p->pCutStore[k];
            if ( pUnitNew->pCut.nLeaves <= pUnit->pCut.nLeaves && 
                (pUnitNew->uSign & pUnit->uSign) == pUnitNew->uSign && 
                 Mpm_CutIsContained(p, &pUnit->pCut, &pUnitNew->pCut) )
            {
                Vec_PtrPush( &p->vFreeUnits, pUnit );
                continue;
            }
            p->pCutStore[last++] = p->pCutStore[k];
        }
        p->nCutStore = last;
#ifdef MIG_RUNTIME
p->timeCompare += Abc_Clock() - clk;
#endif
    }

    // remove the last cut if too many
    if ( p->nCutStore == p->nNumCuts )
        Vec_PtrPush( &p->vFreeUnits, p->pCutStore[--p->nCutStore] );
    assert( p->nCutStore < p->nNumCuts );
    return 1;
}